

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O2

void __thiscall
expression_tree::
cache_on_evaluation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::sequential>
::branch::~branch(branch *this)

{
  ~branch(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

virtual ~branch() {}